

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O1

double __thiscall
lineage::heuristics::
LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
::solveLocalBranchingProblem
          (LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this,size_t partitionIdA,size_t partitionIdB)

{
  size_t sVar1;
  double dVar2;
  LocalBranchingOptimizer localBranchingOptimizer;
  MaskedHungarianBranching<lineage::heuristics::PartitionGraph> local_c8;
  
  sVar1 = ((this->
           super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           ).super_HeuristicBase.data_)->maxDistance;
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::HungarianBranching
            (&local_c8.super_HungarianBranching<lineage::heuristics::PartitionGraph>,
             &(this->
              super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
              ).partitionGraph_);
  local_c8.super_HungarianBranching<lineage::heuristics::PartitionGraph>.
  super_BranchingOptimizer<lineage::heuristics::PartitionGraph>._vptr_BranchingOptimizer =
       (_func_int **)&PTR_optimize_0014cba0;
  local_c8.first_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.first_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.first_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.second_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.second_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.second_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.third_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.third_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.third_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.maxDistance_ = sVar1;
  local_c8.A_ = partitionIdA;
  local_c8.B_ = partitionIdB;
  dVar2 = branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::optimize
                    (&local_c8);
  local_c8.super_HungarianBranching<lineage::heuristics::PartitionGraph>.
  super_BranchingOptimizer<lineage::heuristics::PartitionGraph>._vptr_BranchingOptimizer =
       (_func_int **)&PTR_optimize_0014cba0;
  if (local_c8.third_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.third_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.third_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.third_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.second_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.second_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.second_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.second_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.first_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.first_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.first_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.first_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_c8.super_HungarianBranching<lineage::heuristics::PartitionGraph>.
  super_BranchingOptimizer<lineage::heuristics::PartitionGraph>._vptr_BranchingOptimizer =
       (_func_int **)&PTR_optimize_0014c888;
  if (local_c8.super_HungarianBranching<lineage::heuristics::PartitionGraph>.solution_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super_HungarianBranching<lineage::heuristics::PartitionGraph>.solution_
                    .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super_HungarianBranching<lineage::heuristics::PartitionGraph>.
                          solution_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super_HungarianBranching<lineage::heuristics::PartitionGraph>.
                          solution_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_c8.super_HungarianBranching<lineage::heuristics::PartitionGraph>.partitions_);
  return dVar2;
}

Assistant:

inline double
LocalPartitionOptimizer<BROPT, LBROPT>::solveLocalBranchingProblem(
    size_t partitionIdA, size_t partitionIdB) const
{
    auto localBranchingOptimizer =
        LocalBranchingOptimizer(this->partitionGraph_, partitionIdA,
                                partitionIdB, this->data_.maxDistance);
    return localBranchingOptimizer.optimize();
}